

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v6::internal::bigint::remove_leading_zeros(bigint *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  ulong uVar5;
  
  uVar5 = (this->bigits_).super_buffer<unsigned_int>.size_;
  iVar2 = 1;
  if ((int)uVar5 < 1) {
    iVar2 = (int)uVar5;
  }
  puVar4 = (this->bigits_).super_buffer<unsigned_int>.ptr_ + (uVar5 & 0xffffffff);
  do {
    puVar4 = puVar4 + -1;
    iVar1 = (int)uVar5;
    iVar3 = iVar2;
    if (iVar1 < 2) break;
    uVar5 = (ulong)(iVar1 - 1);
    iVar3 = iVar1;
  } while (*puVar4 == 0);
  uVar5 = (ulong)iVar3;
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar5) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar5);
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar5;
  return;
}

Assistant:

void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && bigits_[num_bigits] == 0) --num_bigits;
    bigits_.resize(num_bigits + 1);
  }